

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeOverwriteContent(MemPage *pPage,u8 *pDest,BtreePayload *pX,int iOffset,int iAmt)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  u8 *in_RDX;
  MemPage *in_RSI;
  int in_R8D;
  bool bVar3;
  int rc_2;
  int rc_1;
  int rc;
  int i;
  int nData;
  PgHdr *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffd0;
  
  iVar1 = *(int *)(in_RDX + 0x24) - in_ECX;
  if (iVar1 < 1) {
    iVar1 = 0;
    while( true ) {
      bVar3 = false;
      if (iVar1 < in_R8D) {
        bVar3 = *(char *)((long)in_RSI->aiOvfl + (long)iVar1 + -0x1c) == '\0';
      }
      if (!bVar3) break;
      iVar1 = iVar1 + 1;
    }
    if (iVar1 < in_R8D) {
      iVar2 = sqlite3PagerWrite(in_stack_ffffffffffffffb8);
      if (iVar2 != 0) {
        return iVar2;
      }
      memset((void *)((long)in_RSI->aiOvfl + (long)iVar1 + -0x1c),0,(long)(in_R8D - iVar1));
    }
  }
  else {
    if ((iVar1 < in_R8D) &&
       (iVar2 = btreeOverwriteContent
                          (in_RSI,in_RDX,(BtreePayload *)CONCAT44(in_ECX,in_R8D),iVar1,
                           in_stack_ffffffffffffffd0), in_R8D = iVar1, iVar2 != 0)) {
      return iVar2;
    }
    iVar1 = memcmp(in_RSI,(void *)(*(long *)(in_RDX + 0x10) + (long)in_ECX),(long)in_R8D);
    if (iVar1 != 0) {
      iVar1 = sqlite3PagerWrite(in_stack_ffffffffffffffb8);
      if (iVar1 != 0) {
        return iVar1;
      }
      memmove(in_RSI,(void *)(*(long *)(in_RDX + 0x10) + (long)in_ECX),(long)in_R8D);
    }
  }
  return 0;
}

Assistant:

static int btreeOverwriteContent(
  MemPage *pPage,           /* MemPage on which writing will occur */
  u8 *pDest,                /* Pointer to the place to start writing */
  const BtreePayload *pX,   /* Source of data to write */
  int iOffset,              /* Offset of first byte to write */
  int iAmt                  /* Number of bytes to be written */
){
  int nData = pX->nData - iOffset;
  if( nData<=0 ){
    /* Overwriting with zeros */
    int i;
    for(i=0; i<iAmt && pDest[i]==0; i++){}
    if( i<iAmt ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memset(pDest + i, 0, iAmt - i);
    }
  }else{
    if( nData<iAmt ){
      /* Mixed read data and zeros at the end.  Make a recursive call
      ** to write the zeros then fall through to write the real data */
      int rc = btreeOverwriteContent(pPage, pDest+nData, pX, iOffset+nData,
                                 iAmt-nData);
      if( rc ) return rc;
      iAmt = nData;
    }
    if( memcmp(pDest, ((u8*)pX->pData) + iOffset, iAmt)!=0 ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      /* In a corrupt database, it is possible for the source and destination
      ** buffers to overlap.  This is harmless since the database is already
      ** corrupt but it does cause valgrind and ASAN warnings.  So use
      ** memmove(). */
      memmove(pDest, ((u8*)pX->pData) + iOffset, iAmt);
    }
  }
  return SQLITE_OK;
}